

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.hpp
# Opt level: O3

void __thiscall
vkt::sparse::SparseShaderIntrinsicsCaseBase::SparseShaderIntrinsicsCaseBase
          (SparseShaderIntrinsicsCaseBase *this,TestContext *testCtx,string *name,
          SpirVFunction function,ImageType imageType,UVec3 *imageSize,TextureFormat *format)

{
  long lVar1;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  tcu::TestCase::TestCase((TestCase *)this,testCtx,(name->_M_dataplus)._M_p,(char *)local_50[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00cec1f0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00cff310;
  this->m_function = function;
  this->m_imageType = imageType;
  lVar1 = 0;
  do {
    (this->m_imageSize).m_data[lVar1] = imageSize->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  this->m_format = *format;
  return;
}

Assistant:

SparseShaderIntrinsicsCaseBase			(tcu::TestContext&			testCtx,
											 const std::string&			name,
											 const SpirVFunction		function,
											 const ImageType			imageType,
											 const tcu::UVec3&			imageSize,
											 const tcu::TextureFormat&	format)
		: TestCase(testCtx, name, "")
		, m_function(function)
		, m_imageType(imageType)
		, m_imageSize(imageSize)
		, m_format(format)
	{
	}